

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O1

void __thiscall cppcms::http::impl::file_buffer::name(file_buffer *this,string *n)

{
  logic_error *this_00;
  string local_40;
  
  if (this->in_memory_ != false) {
    std::__cxx11::string::_M_assign((string *)&this->name_);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"File name updated on open file","");
  booster::logic_error::logic_error(this_00,&local_40);
  __cxa_throw(this_00,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
}

Assistant:

void name(std::string const &n)
	{
		if(!in_memory_)
			throw booster::logic_error("File name updated on open file");
		name_ = n;
	}